

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

int ui32fromtoken(Context_conflict2 *ctx,uint32 *_val)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32 uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = ctx->tokenlen;
  uVar2 = 0;
  while ((uVar3 = uVar1, uVar1 != uVar2 && (uVar3 = uVar2, 0xf5 < (byte)(ctx->token[uVar2] - 0x3aU))
         )) {
    uVar2 = uVar2 + 1;
  }
  if (uVar3 == 0) {
    uVar4 = 0;
    iVar5 = 0;
  }
  else {
    iVar5 = 1;
    uVar4 = 0;
    uVar6 = (ulong)uVar3;
    while (uVar6 != 0) {
      uVar4 = uVar4 + (ctx->token[uVar6 - 1] + -0x30) * iVar5;
      iVar5 = iVar5 * 10;
      uVar6 = uVar6 - 1;
    }
    ctx->token = ctx->token + uVar3;
    ctx->tokenlen = uVar1 - uVar3;
    iVar5 = 1;
  }
  *_val = uVar4;
  return iVar5;
}

Assistant:

static int ui32fromtoken(Context *ctx, uint32 *_val)
{
    unsigned int i;
    for (i = 0; i < ctx->tokenlen; i++)
    {
        if ((ctx->token[i] < '0') || (ctx->token[i] > '9'))
            break;
    } // for

    if (i == 0)
    {
        *_val = 0;
        return 0;
    } // if

    const unsigned int len = i;
    uint32 val = 0;
    uint32 mult = 1;
    while (i--)
    {
        val += ((uint32) (ctx->token[i] - '0')) * mult;
        mult *= 10;
    } // while

    ctx->token += len;
    ctx->tokenlen -= len;

    *_val = val;
    return 1;
}